

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall cmComputeTargetDepends::ComputeIntermediateGraph(cmComputeTargetDepends *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  cmValue cVar4;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_01;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *__x;
  long lVar5;
  allocator<char> local_61;
  cmComputeTargetDepends *local_60;
  ulong local_58;
  string local_50;
  
  lVar5 = 0;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->IntermediateGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->IntermediateGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             ((long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->InitialGraph).
                   super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                   super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x18);
  uVar3 = ((long)(this->InitialGraph).
                 super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                 super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                .super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  local_58 = 0;
  if (0 < (int)uVar3) {
    local_58 = uVar3 & 0xffffffff;
  }
  local_60 = this;
  for (uVar3 = 0; local_58 != uVar3; uVar3 = uVar3 + 1) {
    __x = (vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)
          ((long)&(((local_60->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start)->
                  super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                  super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + lVar5);
    this_01 = (vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)
              ((long)&(((local_60->IntermediateGraph).
                        super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                        super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                        _M_impl.super__Vector_impl_data._M_start)->
                      super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + lVar5);
    this_00 = (local_60->Targets).
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar3];
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if ((TVar2 == STATIC_LIBRARY) ||
       (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 == OBJECT_LIBRARY)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"OPTIMIZE_DEPENDENCIES",&local_61);
      cVar4 = cmGeneratorTarget::GetProperty(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if ((cVar4.Value == (string *)0x0) || (bVar1 = cmIsOn((cmValue)0x383f6a), !bVar1)) {
        std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::operator=(this_01,__x);
      }
      else {
        OptimizeLinkDependencies(local_60,this_00,(cmGraphEdgeList *)this_01,(cmGraphEdgeList *)__x)
        ;
      }
    }
    else {
      std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::operator=(this_01,__x);
    }
    lVar5 = lVar5 + 0x18;
  }
  return;
}

Assistant:

void cmComputeTargetDepends::ComputeIntermediateGraph()
{
  this->IntermediateGraph.resize(0);
  this->IntermediateGraph.resize(this->InitialGraph.size());

  int n = static_cast<int>(this->InitialGraph.size());
  for (int i = 0; i < n; ++i) {
    auto const& initialEdges = this->InitialGraph[i];
    auto& intermediateEdges = this->IntermediateGraph[i];
    cmGeneratorTarget const* gt = this->Targets[i];
    if (gt->GetType() != cmStateEnums::STATIC_LIBRARY &&
        gt->GetType() != cmStateEnums::OBJECT_LIBRARY) {
      intermediateEdges = initialEdges;
    } else {
      if (cmValue optimizeDependencies =
            gt->GetProperty("OPTIMIZE_DEPENDENCIES")) {
        if (cmIsOn(optimizeDependencies)) {
          this->OptimizeLinkDependencies(gt, intermediateEdges, initialEdges);
        } else {
          intermediateEdges = initialEdges;
        }
      } else {
        intermediateEdges = initialEdges;
      }
    }
  }
}